

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O1

void fmt::v6::internal::format_value<char,Query>(buffer<char> *buf,Query *value,locale_ref loc)

{
  long lVar1;
  ulong uVar2;
  formatbuf<char> format_buf;
  basic_ostream<char,_std::char_traits<char>_> output;
  locale_ref lStack_198;
  void *local_190;
  locale local_188 [8];
  undefined **local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  locale local_148 [8];
  buffer<char> *local_140;
  long local_138;
  ios_base local_130 [20];
  undefined4 auStack_11c [61];
  
  local_180 = (undefined **)__cxa_guard_release;
  local_178 = 0;
  uStack_170 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_190 = loc.locale_;
  std::locale::locale(local_148);
  local_180 = &PTR__streambuf_00261a28;
  local_140 = buf;
  std::ostream::ostream(&local_138,(streambuf *)&local_180);
  if (local_190 != (void *)0x0) {
    locale_ref::get<std::locale>(&lStack_198);
    std::ios::imbue(local_188);
    std::locale::~locale(local_188);
    std::locale::~locale((locale *)&lStack_198);
  }
  lVar1 = *(long *)(local_138 + -0x18);
  *(undefined4 *)((long)auStack_11c + lVar1) = 5;
  std::ios::clear((int)&lStack_198 + (int)lVar1 + 0x60);
  operator<<((ostream *)&local_138,value);
  uVar2 = buf->size_;
  if (buf->capacity_ < uVar2) {
    (**buf->_vptr_buffer)(buf,uVar2);
  }
  buf->size_ = uVar2;
  std::ios_base::~ios_base(local_130);
  local_180 = (undefined **)__cxa_guard_release;
  std::locale::~locale(local_148);
  return;
}

Assistant:

void format_value(buffer<Char>& buf, const T& value,
                  locale_ref loc = locale_ref()) {
  formatbuf<Char> format_buf(buf);
  std::basic_ostream<Char> output(&format_buf);
  if (loc) output.imbue(loc.get<std::locale>());
  output.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  output << value;
  buf.resize(buf.size());
}